

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O2

void ewmh_remove_window_state(natwm_state *state,xcb_window_t window)

{
  xcb_change_property(state->xcb,0,window,state->ewmh->_NET_WM_STATE,4,0x20,0,0);
  return;
}

Assistant:

void ewmh_remove_window_state(const struct natwm_state *state, xcb_window_t window)
{
        xcb_change_property(state->xcb,
                            XCB_PROP_MODE_REPLACE,
                            window,
                            state->ewmh->_NET_WM_STATE,
                            XCB_ATOM_ATOM,
                            32,
                            0,
                            NULL);
}